

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

uint objgetp(mcmcxdef *mctx,objnum objn,prpnum prop,dattyp *typptr)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  uint16_t tmp;
  bool bVar14;
  
  bVar13 = (byte)prop;
  bVar12 = (byte)(prop >> 8);
  puVar1 = mcmlck(mctx,objn);
  uVar3 = (uint)*(ushort *)(puVar1 + 6);
  if ((puVar1[2] & 2) == 0) {
    if (*(ushort *)(puVar1 + 6) != 0) {
      pbVar4 = puVar1 + (ulong)*(ushort *)(puVar1 + 4) * 2 + 0xe;
      uVar11 = 0;
      do {
        if ((*pbVar4 == bVar13) && (pbVar4[1] == bVar12)) {
          if ((pbVar4[5] & 2) == 0) {
            if (((pbVar4[5] & 4) == 0) || ((mctx->mcmcxflg & 1) != 0)) {
              uVar3 = (int)pbVar4 - (int)puVar1;
              if (uVar3 == 0) {
                uVar3 = (uint)uVar11;
              }
              uVar11 = (ulong)uVar3;
              break;
            }
          }
          else {
            uVar11 = (ulong)(uint)((int)pbVar4 - (int)puVar1);
          }
        }
        pbVar4 = pbVar4 + (ulong)*(ushort *)(pbVar4 + 3) + 6;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
LAB_00215e96:
      uVar10 = (uint)uVar11;
      if ((typptr != (dattyp *)0x0) && (uVar10 != 0)) {
        *typptr = (uint)puVar1[uVar11 + 2];
      }
      goto LAB_00215f0d;
    }
  }
  else if (uVar3 != 0) {
    iVar8 = uVar3 - 1;
    iVar6 = 0;
    do {
      iVar9 = iVar8 - iVar6;
      iVar2 = iVar9 / 2 + iVar6;
      bVar14 = puVar1[(long)iVar2 * 4 + (ulong)*(ushort *)(puVar1 + 8)] < bVar13;
      if (puVar1[(long)iVar2 * 4 + (ulong)*(ushort *)(puVar1 + 8)] == bVar13) {
        puVar7 = puVar1 + (long)iVar2 * 4 + (ulong)*(ushort *)(puVar1 + 8);
        bVar14 = puVar7[1] < bVar12;
        if (puVar7[1] == bVar12) {
          uVar5 = *(ushort *)(puVar7 + 2);
          goto LAB_00215f2f;
        }
      }
      if (bVar14) {
        iVar6 = iVar6 + 1;
        if (2 < iVar9 + 1U) {
          iVar6 = iVar2;
        }
      }
      else {
        bVar14 = iVar2 != iVar8;
        iVar8 = iVar8 + -1;
        if (bVar14) {
          iVar8 = iVar2;
        }
      }
    } while (iVar6 <= iVar8);
  }
LAB_00215f0a:
  uVar10 = 0;
LAB_00215f0d:
  mcmunlck(mctx,objn);
  return uVar10;
LAB_00215f2f:
  if (uVar5 == 0) goto LAB_00215f0a;
  uVar11 = (ulong)uVar5;
  if (((((puVar1[uVar11 + 5] & 2) == 0) &&
       (((puVar1[uVar11 + 5] & 4) == 0 || ((mctx->mcmcxflg & 1) != 0)))) || ((int)uVar3 <= iVar2))
     || ((*puVar7 != puVar7[4] || (puVar7[1] != puVar7[5])))) goto LAB_00215e96;
  uVar5 = *(ushort *)(puVar7 + 6);
  puVar7 = puVar7 + 4;
  goto LAB_00215f2f;
}

Assistant:

uint objgetp(mcmcxdef *mctx, objnum objn, prpnum prop, dattyp *typptr)
{
    objdef *objptr;
    prpdef *p;
    int     cnt;
    uint    retval;                       /* property offset, if we find it */
    uint    ignprop; /* ignored property - use if real property isn't found */
    uchar   pbuf[2];                  /* property number in portable format */
    uchar  *indp;
    uchar  *indbase;
    int     last;
    int     first;
    int     cur;
    
    oswp2(pbuf, prop);            /* get property number in portable foramt */
    objptr = (objdef *)mcmlck(mctx, objn);      /* get a lock on the object */
    ignprop = 0;                   /* assume we won't find ignored property */
    cnt = objnprop(objptr);             /* get number of properties defined */
    retval = 0;                                          /* presume failure */
    
    if (objflg(objptr) & OBJFINDEX)
    {
        /* there's an index -> do a binary search through the index */
        indbase = (uchar *)objpfre(objptr);                   /* find index */
        first = 0;
        last = cnt - 1;
        for (;;)
        {
            if (first > last) break;           /* crossed over -> not found */
            cur = first + (last - first)/2;         /* split the difference */
            indp = indbase + cur*4;            /* get pointer to this entry */
            if (indp[0] == pbuf[0] && indp[1] == pbuf[1])
            {
                retval = osrp2(indp + 2);
                break;
            }
            else if (indp[0] < pbuf[0]
                     || (indp[0] == pbuf[0] && indp[1] < pbuf[1]))
                first = (cur == first ? first + 1 : cur);
            else
                last = (cur == last ? last - 1 : cur);
        }

        /* ignore ignored and deleted properties if possible */
        while (retval
               && ((prpflg(objptr + retval) & PRPFIGN) != 0
                   || ((prpflg(objptr + retval) & PRPFDEL) != 0
                       && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0))
               && cur < cnt && indp[0] == indp[4] && indp[1] == indp[5])
        {
            indp += 4;
            retval = osrp2(indp + 2);
        }
        if (retval && osrp2(objptr + retval) != prop)
            assert(FALSE);
    }
    else
    {
        /* there's no index -> do sequential search through properties */
        for (p = objprp(objptr) ; cnt ; p = objpnxt(p), --cnt)
        {
            /* if this is the property, and it's not being ignored, use it */
            if (*(uchar *)p == pbuf[0] && *(((uchar *)p) + 1) == pbuf[1])
            {
                if (prpflg(p) & PRPFIGN)                 /* this is ignored */
                    ignprop = objpofs(objptr, p);  /* ... make a note of it */
                else if ((prpflg(p) & PRPFDEL) != 0         /* it's deleted */
                         && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0)
                    /* simply skip it */ ;
                else
                {
                    retval = objpofs(objptr, p);         /* this is the one */
                    break;                                    /* we're done */
                }
            }
        }
    }

    if (!retval) retval = ignprop;     /* use ignored value if nothing else */
    if (retval && typptr) *typptr = prptype(objofsp(objptr, retval));
    
    mcmunlck(mctx, objn);                 /* done with object, so unlock it */
    return(retval);
}